

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O2

void __thiscall
SoundConfigTab::rescan<AudioEnumerator>
          (SoundConfigTab *this,AudioEnumerator *enumerator,DeviceGroup *group)

{
  int iVar1;
  QSignalBlocker blocker;
  QString current;
  
  QSignalBlocker::QSignalBlocker(&blocker,(QObject *)group->mDeviceCombo);
  QComboBox::currentText();
  iVar1 = QComboBox::currentIndex();
  AudioEnumerator::populate(enumerator,iVar1);
  DeviceGroup::populateDevices<AudioEnumerator>(group,enumerator);
  iVar1 = QComboBox::findText(group->mDeviceCombo,&current,(MatchFlags)0x10);
  if (iVar1 == -1) {
    ConfigTab::setDirty<(Config::Category)1>(&this->super_ConfigTab);
  }
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&current.d);
  QSignalBlocker::~QSignalBlocker(&blocker);
  return;
}

Assistant:

void SoundConfigTab::rescan(Enumerator &enumerator, DeviceGroup *group) {
    QSignalBlocker blocker(group->mDeviceCombo);

    // save the current selection
    auto const current = group->mDeviceCombo->currentText();

    // rescan the device list and update the combo
    enumerator.populate(group->mApiCombo->currentIndex());
    group->populateDevices(enumerator);

    // search for the current in the new list, defaulting to 0 if not found
    auto index = group->mDeviceCombo->findText(current);
    if (index == -1) {
        // not found, select the first
        index = 0;
        setDirtyFromEnumerator<Enumerator>();
    }
    group->mDeviceCombo->setCurrentIndex(index);
}